

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

void __thiscall DnsStats::RegisterEdnsUsage(DnsStats *this,uint32_t flags,uint32_t *e_rcode)

{
  uint32_t number;
  int i;
  uint uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(flags | 0x8000);
  if (this->dnssec_packet == (uint8_t *)0x0) {
    uVar2 = (ulong)flags;
  }
  if (e_rcode != (uint32_t *)0x0) {
    *e_rcode = (uint32_t)(uVar2 >> 0x18);
  }
  this->is_using_edns = true;
  this->is_do_flag_set = (bool)((byte)(uVar2 >> 0xf) & 1);
  number = 0xf;
  for (uVar1 = 0; uVar1 != 0x10; uVar1 = uVar1 + 1) {
    if (((uint)uVar2 >> (uVar1 & 0x1f) & 1) != 0) {
      SubmitRegistryNumber(this,10,number);
    }
    number = number - 1;
  }
  SubmitRegistryNumber(this,0xb,(uint)uVar2 >> 0x10 & 0xff);
  return;
}

Assistant:

void DnsStats::RegisterEdnsUsage(uint32_t flags, uint32_t* e_rcode)
{
    /* Little safety because flags are set differently for some packets */
    if (dnssec_packet != NULL) {
        flags |= (1 << 15);
    }
    /* Process the flags and rcodes */
    if (e_rcode != NULL)
    {
        *e_rcode = (flags >> 24) & 0xFF;
    }

    /* Register that EDNS was used */
    is_using_edns = true;

    /* Register whether the DO bit was set */
    is_do_flag_set = (flags & (1 << 15)) != 0;

    /* Add flags to registration */
    for (int i = 0; i < 16; i++)
    {
        if ((flags & (1 << i)) != 0)
        {
            SubmitRegistryNumber(REGISTRY_EDNS_Header_Flags, 15 - i);
        }
    }

    SubmitRegistryNumber(REGISTRY_EDNS_Version_number, (flags >> 16) & 0xFF);
}